

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::traversedashwordlistdashfindfirst(Forth *this)

{
  uint uVar1;
  pointer pDVar2;
  uint Value;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDFIRST");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pDVar2 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  Value = 0;
  do {
    if (pDVar2 == (this->definitions).
                  super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
LAB_001148d2:
      ForthStack<unsigned_int>::setTop(&this->dStack,Value);
      return;
    }
    if (((pDVar2[-1].flags & pDVar2[-1].FlagHidden) == 0) && (pDVar2[-1].searchOrder == uVar1)) {
      Value = pDVar2[-1].numberInVector;
      goto LAB_001148d2;
    }
    pDVar2 = pDVar2 + -1;
  } while( true );
}

Assistant:

void traversedashwordlistdashfindfirst(){
							REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDFIRST");
							auto wid = dStack.getTop(); 
							for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
								auto& defnLook = *i;
								//if (!defn.isFindable())
								if (defnLook.isHidden())
									continue;
								if(defnLook.searchOrder==wid){
									dStack.setTop(defnLook.numberInVector);
									return;
								}
							}
							dStack.setTop(0);	
		}